

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void do_atomic_op_i32(TCGContext_conflict9 *tcg_ctx,TCGv_i32 ret,TCGv_i32 addr,TCGv_i32 val,
                     TCGArg idx,MemOp memop,void **table)

{
  code *pcVar1;
  MemOp opc;
  TCGMemOpIdx val_00;
  TCGv_i32 arg;
  TCGv_i32 oi;
  gen_atomic_op_i32_conflict9 gen;
  MemOp memop_local;
  TCGArg idx_local;
  TCGv_i32 val_local;
  TCGv_i32 addr_local;
  TCGv_i32 ret_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  opc = tcg_canonicalize_memop(memop,false,false);
  pcVar1 = (code *)table[opc & MO_BEQ];
  val_00 = make_memop_idx(opc & ~MO_ASHIFT,(uint)idx);
  arg = tcg_const_i32_tricore(tcg_ctx,val_00);
  (*pcVar1)(tcg_ctx,ret,tcg_ctx->cpu_env,addr,val,arg);
  tcg_temp_free_i32(tcg_ctx,arg);
  if ((opc & MO_ASHIFT) != MO_8) {
    tcg_gen_ext_i32(tcg_ctx,ret,ret,opc);
  }
  return;
}

Assistant:

static void do_atomic_op_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv addr, TCGv_i32 val,
                             TCGArg idx, MemOp memop, void * const table[])
{
    gen_atomic_op_i32 gen;

    memop = tcg_canonicalize_memop(memop, 0, 0);

    gen = table[memop & (MO_SIZE | MO_BSWAP)];
    tcg_debug_assert(gen != NULL);

    {
        TCGv_i32 oi = tcg_const_i32(tcg_ctx, make_memop_idx(memop & ~MO_SIGN, idx));
        gen(tcg_ctx, ret, tcg_ctx->cpu_env, addr, val, oi);
        tcg_temp_free_i32(tcg_ctx, oi);
    }

    if (memop & MO_SIGN) {
        tcg_gen_ext_i32(tcg_ctx, ret, ret, memop);
    }
}